

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

Result tonk::InitializeAddressHash(void)

{
  Result RVar1;
  ErrorResult *in_RAX;
  ErrorResult *in_RDI;
  Result result;
  
  result.Error = in_RAX;
  SecureRandom_Next((tonk *)&result,(uint8_t *)&m_SecretSeed,8);
  RVar1.Error = result.Error;
  if (result.Error != (ErrorResult *)0x0) {
    result.Error = (ErrorResult *)0x0;
  }
  in_RDI->Source = (char *)RVar1.Error;
  Result::~Result(&result);
  return (Result)in_RDI;
}

Assistant:

Result InitializeAddressHash()
{
    Result result = SecureRandom_Next((uint8_t*)&m_SecretSeed, sizeof(m_SecretSeed));
    if (result.IsFail()) {
        return result;
    }

    m_SeedInitialized = true;
    return Result::Success();
}